

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltests.c
# Opt level: O0

int get_limits(lua_State *L)

{
  lua_State *L_local;
  
  lua_createtable(L,0,5);
  setnameval(L,"BITS_INT",0x20);
  setnameval(L,"MAXARG_Ax",0xffffff);
  setnameval(L,"MAXARG_Bx",0xffff);
  setnameval(L,"MAXARG_sBx",0x8000);
  setnameval(L,"BITS_INT",0x20);
  setnameval(L,"LFPF",0x32);
  setnameval(L,"NUM_OPCODES",0x75);
  return 1;
}

Assistant:

static int get_limits (lua_State *L) {
  lua_createtable(L, 0, 5);
  setnameval(L, "BITS_INT", LUAI_BITSINT);
  setnameval(L, "MAXARG_Ax", MAXARG_Ax);
  setnameval(L, "MAXARG_Bx", MAXARG_Bx);
  setnameval(L, "MAXARG_sBx", MAXARG_sBx);
  setnameval(L, "BITS_INT", LUAI_BITSINT);
  setnameval(L, "LFPF", LFIELDS_PER_FLUSH);
  setnameval(L, "NUM_OPCODES", NUM_OPCODES);
  return 1;
}